

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall MarrayTest::reshapeTest(MarrayTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  size_t sVar2;
  logic_error *plVar3;
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_6d;
  CoordinateOrder local_6c;
  View<int,_false,_std::allocator<unsigned_long>_> local_68;
  
  _Var1._M_current = (unsigned_long *)operator_new(0x10);
  *_Var1._M_current = 6;
  _Var1._M_current[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_68,_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 2),&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&local_6c);
  *_Var1._M_current = 4;
  _Var1._M_current[1] = 6;
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&local_68,_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 2));
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,0);
  if (sVar2 == 4) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,1);
    if (sVar2 == 6) {
      operator_delete(local_68.data_,local_68.geometry_.size_ << 2);
      operator_delete(local_68.geometry_.shape_,local_68.geometry_.dimension_ * 0x18);
      operator_delete(_Var1._M_current,0x10);
      _Var1._M_current = (unsigned_long *)operator_new(0x10);
      *_Var1._M_current = 6;
      _Var1._M_current[1] = 4;
      local_6c = FirstMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_68,_Var1,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var1._M_current + 2),&this->scalar_,&local_6c,&local_6d);
      *_Var1._M_current = 4;
      _Var1._M_current[1] = 6;
      andres::View<int,false,std::allocator<unsigned_long>>::
      reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,false,std::allocator<unsigned_long>> *)&local_68,_Var1,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var1._M_current + 2));
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,0);
      if (sVar2 == 4) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,1);
        if (sVar2 == 6) {
          operator_delete(local_68.data_,local_68.geometry_.size_ << 2);
          operator_delete(local_68.geometry_.shape_,local_68.geometry_.dimension_ * 0x18);
          operator_delete(_Var1._M_current,0x10);
          _Var1._M_current = (unsigned_long *)operator_new(0x18);
          *_Var1._M_current = 3;
          _Var1._M_current[1] = 4;
          _Var1._M_current[2] = 2;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_68,_Var1,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var1._M_current + 3),&this->scalar_,&andres::defaultOrder,
                     (allocator_type *)&local_6c);
          *_Var1._M_current = 2;
          _Var1._M_current[1] = 3;
          _Var1._M_current[2] = 4;
          andres::View<int,false,std::allocator<unsigned_long>>::
          reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((View<int,false,std::allocator<unsigned_long>> *)&local_68,_Var1,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var1._M_current + 3));
          sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,0);
          if (sVar2 == 2) {
            sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,1);
            if (sVar2 == 3) {
              sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,2);
              if (sVar2 == 4) {
                operator_delete(local_68.data_,local_68.geometry_.size_ << 2);
                operator_delete(local_68.geometry_.shape_,local_68.geometry_.dimension_ * 0x18);
                operator_delete(_Var1._M_current,0x18);
                _Var1._M_current = (unsigned_long *)operator_new(0x18);
                *_Var1._M_current = 3;
                _Var1._M_current[1] = 4;
                _Var1._M_current[2] = 2;
                local_6c = FirstMajorOrder;
                andres::Marray<int,std::allocator<unsigned_long>>::
                Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          ((Marray<int,std::allocator<unsigned_long>> *)&local_68,_Var1,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )(_Var1._M_current + 3),&this->scalar_,&local_6c,&local_6d);
                *_Var1._M_current = 2;
                _Var1._M_current[1] = 3;
                _Var1._M_current[2] = 4;
                andres::View<int,false,std::allocator<unsigned_long>>::
                reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          ((View<int,false,std::allocator<unsigned_long>> *)&local_68,_Var1,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )(_Var1._M_current + 3));
                sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&local_68,0)
                ;
                if (sVar2 == 2) {
                  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                    (&local_68,1);
                  if (sVar2 == 3) {
                    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                      (&local_68,2);
                    if (sVar2 == 4) {
                      operator_delete(local_68.data_,local_68.geometry_.size_ << 2);
                      operator_delete(local_68.geometry_.shape_,local_68.geometry_.dimension_ * 0x18
                                     );
                      operator_delete(_Var1._M_current,0x18);
                      return;
                    }
                  }
                }
                plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar3,"test failed.");
                __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
          }
          plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar3,"test failed.");
          __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar3,"test failed.");
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar3,"test failed.");
  __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void MarrayTest::reshapeTest() {
    // 2D 
    {
        std::vector<std::size_t> shape(2); 
        shape[0] = 6; 
        shape[1] = 4;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
        shape[0] = 4; 
        shape[1] = 6; 
        m.reshape(shape.begin(), shape.end());

        test(m.shape(0)==4 &&
               m.shape(1)==6);
    }
    {
        std::vector<std::size_t> shape(2); 
        shape[0] = 6; 
        shape[1] = 4;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_, andres::FirstMajorOrder);
        shape[0] = 4; 
        shape[1] = 6; 
        m.reshape(shape.begin(), shape.end());

        test(m.shape(0)==4 &&
               m.shape(1)==6);
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4; 
        shape[2] = 2;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
        shape[0] = 2;
        shape[1] = 3; 
        shape[2] = 4;
        m.reshape(shape.begin(), shape.end());
    
        test(m.shape(0)==2 &&
               m.shape(1)==3 &&
               m.shape(2)==4);
    }
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4; 
        shape[2] = 2;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_, andres::FirstMajorOrder);
        shape[0] = 2;
        shape[1] = 3; 
        shape[2] = 4;
        m.reshape(shape.begin(), shape.end());
    
        test(m.shape(0)==2 &&
               m.shape(1)==3 &&
               m.shape(2)==4);
    }
}